

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_init(iso9660_conflict *iso9660,vdd *vdd,idr *idr)

{
  idr *idr_local;
  vdd *vdd_local;
  iso9660_conflict *iso9660_local;
  
  idr->idrent_pool = (idrent *)0x0;
  idr->pool_size = 0;
  if (vdd->vdd_type != VDD_JOLIET) {
    if (((uint)iso9660->opt >> 0xe & 7) < 4) {
      memcpy(idr->char_map,"",0x80);
    }
    else {
      memcpy(idr->char_map,"",0x80);
      idr_relaxed_filenames(idr->char_map);
    }
  }
  return;
}

Assistant:

static void
idr_init(struct iso9660 *iso9660, struct vdd *vdd, struct idr *idr)
{

	idr->idrent_pool = NULL;
	idr->pool_size = 0;
	if (vdd->vdd_type != VDD_JOLIET) {
		if (iso9660->opt.iso_level <= 3) {
			memcpy(idr->char_map, d_characters_map,
			    sizeof(idr->char_map));
		} else {
			memcpy(idr->char_map, d1_characters_map,
			    sizeof(idr->char_map));
			idr_relaxed_filenames(idr->char_map);
		}
	}
}